

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegRangePtr
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom,int neg,xmlRegAtomType type,int start
                  ,int end,xmlChar *blockName)

{
  int iVar1;
  xmlRegRangePtr *ppxVar2;
  xmlRegRangePtr pxVar3;
  uint uVar4;
  uint uVar5;
  char *extra;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    ctxt->error = 0x5aa;
    extra = "add range: atom is NULL";
  }
  else {
    if (atom->type == XML_REGEXP_RANGES) {
      iVar1 = atom->maxRanges;
      if (iVar1 <= atom->nbRanges) {
        if (iVar1 < 1) {
          uVar5 = 4;
        }
        else {
          uVar5 = 0xffffffff;
          if (iVar1 < 1000000000) {
            uVar4 = iVar1 + 1U >> 1;
            uVar5 = uVar4 + iVar1;
            if ((int)(1000000000 - uVar4) < iVar1) {
              uVar5 = 1000000000;
            }
          }
        }
        if (((int)uVar5 < 0) ||
           (ppxVar2 = (xmlRegRangePtr *)(*xmlRealloc)(atom->ranges,(ulong)uVar5 << 3),
           ppxVar2 == (xmlRegRangePtr *)0x0)) {
          ctxt->error = 2;
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                              (xmlError *)0x0);
          return (xmlRegRangePtr)0x0;
        }
        atom->ranges = ppxVar2;
        atom->maxRanges = uVar5;
      }
      pxVar3 = xmlRegNewRange(ctxt,neg,type,start,end);
      if (pxVar3 == (xmlRegRangePtr)0x0) {
        return (xmlRegRangePtr)0x0;
      }
      pxVar3->blockName = blockName;
      iVar1 = atom->nbRanges;
      atom->nbRanges = iVar1 + 1;
      atom->ranges[iVar1] = pxVar3;
      return pxVar3;
    }
    ctxt->error = 0x5aa;
    extra = "add range: atom is not ranges";
  }
  xmlRegexpErrCompile(ctxt,extra);
  return (xmlRegRangePtr)0x0;
}

Assistant:

static xmlRegRangePtr
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom,
	           int neg, xmlRegAtomType type, int start, int end,
		   xmlChar *blockName) {
    xmlRegRangePtr range;

    if (atom == NULL) {
	ERROR("add range: atom is NULL");
	return(NULL);
    }
    if (atom->type != XML_REGEXP_RANGES) {
	ERROR("add range: atom is not ranges");
	return(NULL);
    }
    if (atom->nbRanges >= atom->maxRanges) {
	xmlRegRangePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(atom->maxRanges, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
        }
	tmp = xmlRealloc(atom->ranges, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	atom->ranges = tmp;
	atom->maxRanges = newSize;
    }
    range = xmlRegNewRange(ctxt, neg, type, start, end);
    if (range == NULL)
	return(NULL);
    range->blockName = blockName;
    atom->ranges[atom->nbRanges++] = range;

    return(range);
}